

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,WhileNode *whileNode)

{
  ExpNode *pEVar1;
  StmtNode *pSVar2;
  undefined1 uVar3;
  
  pEVar1 = whileNode->head;
  if (pEVar1 != (ExpNode *)0x0) {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
    pSVar2 = whileNode->body;
    if (pSVar2 != (StmtNode *)0x0) {
      breakDepth = breakDepth + 1;
      (*(pSVar2->super_ASTNode)._vptr_ASTNode[3])(pSVar2,this);
      breakDepth = breakDepth + -1;
    }
    if (whileNode->head->type != 8) {
      fprintf(_stderr,
              "[SEMANTIC ERROR - whileNode] CONDITION EXPRESSION MUST BE BOOLEAN, line: %d\n",
              (ulong)(uint)(whileNode->super_StmtNode).super_ASTNode.line);
    }
    if (whileNode->body == (StmtNode *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (whileNode->body->super_ASTNode).field_0xc;
    }
    (whileNode->super_StmtNode).super_ASTNode.field_0xc = uVar3;
    return;
  }
  fprintf(_stderr,"[SEMANTIC ERROR - whileNode] IF WITHOUT A VALID CONDITION, line: %d\n",
          (ulong)(uint)(whileNode->super_StmtNode).super_ASTNode.line);
  return;
}

Assistant:

void SemanticTypes::visit(WhileNode *whileNode) {
    if (whileNode->getHead()) {
        whileNode->getHead()->accept(this);
    } else {
        fprintf(stderr,
                "[SEMANTIC ERROR - whileNode] IF WITHOUT A VALID CONDITION, line: %d\n",
                whileNode->getLine());
        return;
    }

    if (whileNode->getBody()) {
        breakDepth += 1;
        whileNode->getBody()->accept(this);
        breakDepth -= 1;
    }

    if (whileNode->getHead()->getType() != BOOL) {
        fprintf(stderr,
                "[SEMANTIC ERROR - whileNode] CONDITION EXPRESSION MUST BE BOOLEAN, line: %d\n",
                whileNode->getLine());
    }

    whileNode->setReturn(whileNode->getBody() && whileNode->getBody()->isReturn());

}